

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_write_bin(mpack_writer_t *writer,char *data,uint32_t count)

{
  ulong __n;
  
  mpack_start_bin(writer,count);
  __n = (ulong)count;
  if ((ulong)((long)writer->end - (long)writer->current) < __n) {
    mpack_write_native_straddle(writer,data,__n);
    return;
  }
  memcpy(writer->current,data,__n);
  writer->current = writer->current + __n;
  return;
}

Assistant:

void mpack_write_bin(mpack_writer_t* writer, const char* data, uint32_t count) {
    mpack_assert(data != NULL, "data pointer for bin of %i bytes is NULL", (int)count);
    mpack_start_bin(writer, count);
    mpack_write_bytes(writer, data, count);
    mpack_finish_bin(writer);
}